

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void PPRF_compute_all_keys(vector<GGMNode,_std::allocator<GGMNode>_> *node_list,int level)

{
  pointer pGVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int start_level;
  pointer pGVar5;
  iterator iVar6;
  mapped_type puVar7;
  mapped_type *ppuVar8;
  long offset;
  long lVar9;
  int iVar10;
  long local_88;
  int local_80;
  int local_7c;
  uint8_t derive_key [16];
  
  pGVar1 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_80 = level;
  for (pGVar5 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
                super__Vector_impl_data._M_start; pGVar5 != pGVar1; pGVar5 = pGVar5 + 1) {
    local_7c = local_80 - pGVar5->level;
    uVar3 = *(undefined8 *)pGVar5->key;
    uVar4 = *(undefined8 *)(pGVar5->key + 8);
    lVar9 = (pGVar5->index << ((byte)local_7c & 0x3f)) << 0x20;
    iVar10 = 0;
    while( true ) {
      start_level = local_7c;
      dVar2 = ldexp(1.0,local_7c);
      if (dVar2 <= (double)iVar10) break;
      offset = lVar9 >> 0x20;
      derive_key._0_8_ = uVar3;
      derive_key._8_8_ = uVar4;
      GGMTree::derive_key_from_tree(derive_key,offset,start_level,0);
      local_88 = offset;
      iVar6 = std::
              _Hashtable<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&keys._M_h,&local_88);
      if (iVar6.super__Node_iterator_base<std::pair<const_long,_unsigned_char_*>,_false>._M_cur ==
          (__node_type *)0x0) {
        puVar7 = (mapped_type)malloc(0x10);
        local_88 = offset;
        ppuVar8 = std::__detail::
                  _Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&keys,&local_88);
        *ppuVar8 = puVar7;
        local_88 = offset;
        ppuVar8 = std::__detail::
                  _Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&keys,&local_88);
        puVar7 = *ppuVar8;
        *(undefined8 *)puVar7 = derive_key._0_8_;
        *(undefined8 *)(puVar7 + 8) = derive_key._8_8_;
      }
      lVar9 = lVar9 + 0x100000000;
      iVar10 = iVar10 + 1;
    }
  }
  return;
}

Assistant:

void PPRF_compute_all_keys(const vector<GGMNode>& node_list, int level) {
    for(GGMNode node : node_list) {
        for (int i = 0; i < pow(2, level - node.level); ++i) {
            int offset = ((node.index) << (level - node.level)) + i;
            uint8_t derive_key[AES_BLOCK_SIZE];
            memcpy(derive_key, node.key, AES_BLOCK_SIZE);
            GGMTree::derive_key_from_tree(derive_key,  offset, level - node.level, 0);
            if(keys.find(offset) == keys.end()) {
                keys[offset] = (uint8_t*) malloc(AES_BLOCK_SIZE);
                memcpy(keys[offset], derive_key, AES_BLOCK_SIZE);
//                for (int j = 0 ; j <16; ++j){
//                    printf ( "%02x ",keys[offset][j]);
//                }
//                cout << endl;
            }
        }
    }
}